

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void diy::Serialization<diy::AMRLink::Description>::load(BinaryBuffer *bb,Description *x)

{
  BinaryBuffer *in_RSI;
  Bounds<int> *in_stack_ffffffffffffffe8;
  
  load<int>(in_RSI,(int *)in_stack_ffffffffffffffe8);
  load<diy::DynamicPoint<int,4ul>>(in_RSI,&in_stack_ffffffffffffffe8->min);
  load<diy::Bounds<int>>(in_RSI,in_stack_ffffffffffffffe8);
  load<diy::Bounds<int>>(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void         load(diy::BinaryBuffer& bb, diy::AMRLink::Description& x)
        {
            diy::load(bb, x.level);
            diy::load(bb, x.refinement);
            diy::load(bb, x.core);
            diy::load(bb, x.bounds);
        }